

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxClassDefaults::FxClassDefaults(FxClassDefaults *this,FxExpression *X,FScriptPosition *pos)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ClassDefaults,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxClassDefaults_00706828;
  this->obj = X;
  this->EmitTail = false;
  return;
}

Assistant:

FxClassDefaults::FxClassDefaults(FxExpression *X, const FScriptPosition &pos)
	: FxExpression(EFX_ClassDefaults, pos)
{
	obj = X;
	EmitTail = false;
}